

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

bool __thiscall
andres::View<float,false,std::allocator<unsigned_long>>::
overlaps<float,false,std::allocator<unsigned_long>>
          (View<float,false,std::allocator<unsigned_long>> *this,
          View<float,_false,_std::allocator<unsigned_long>_> *v)

{
  reference pfVar1;
  reference pfVar2;
  bool bVar3;
  reference pfVar4;
  reference pfVar5;
  void *vDataPointer_;
  void *dataPointer_;
  
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  pfVar1 = *(reference *)this;
  if ((pfVar1 == (reference)0x0) || (pfVar2 = v->data_, pfVar2 == (reference)0x0)) {
    bVar3 = false;
  }
  else {
    pfVar4 = View<float,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<float,_false,_std::allocator<unsigned_long>_> *)this,
                        *(long *)(this + 0x30) - 1);
    pfVar5 = View<float,_false,_std::allocator<unsigned_long>_>::operator()
                       (v,(v->geometry_).size_ - 1);
    if ((pfVar2 < pfVar1) || (pfVar4 < pfVar2)) {
      if (pfVar1 < pfVar2) {
        return false;
      }
      if (pfVar5 < pfVar1) {
        return false;
      }
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

inline bool View<T, isConst, A>::overlaps
(
    const View<TLocal, isConstLocal, ALocal>& v
) const
{
    testInvariant();
    if(!MARRAY_NO_ARG_TEST) {
        v.testInvariant();
    }
    if(data_ == 0 || v.data_ == 0) {
        return false;
    }
    else {
        const void* dataPointer_ = data_;
        const void* vDataPointer_ = v.data_;
        const void* maxPointer = & (*this)(this->size()-1);
        const void* maxPointerV = & v(v.size()-1);
        if(    (dataPointer_   <= vDataPointer_ && vDataPointer_ <= maxPointer)
            || (vDataPointer_ <= dataPointer_   && dataPointer_   <= maxPointerV) )
        {
            return true;
        }
    }
    return false;
}